

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtHashMap.h
# Opt level: O3

void __thiscall cbtHashString::cbtHashString(cbtHashString *this,char *name)

{
  char *pcVar1;
  uint uVar2;
  char cVar3;
  allocator local_9;
  
  std::__cxx11::string::string((string *)this,name,&local_9);
  pcVar1 = (this->m_string1)._M_dataplus._M_p;
  cVar3 = *pcVar1;
  if (cVar3 == '\0') {
    uVar2 = 0x811c9dc5;
  }
  else {
    uVar2 = 0x811c9dc5;
    do {
      pcVar1 = pcVar1 + 1;
      uVar2 = ((int)cVar3 ^ uVar2) * 0x1000193;
      cVar3 = *pcVar1;
    } while (cVar3 != '\0');
  }
  this->m_hash = uVar2;
  return;
}

Assistant:

cbtHashString(const char* name)
		: m_string1(name)
	{
		/* magic numbers from http://www.isthe.com/chongo/tech/comp/fnv/ */
		static const unsigned int InitialFNV = 2166136261u;
		static const unsigned int FNVMultiple = 16777619u;

		/* Fowler / Noll / Vo (FNV) Hash */
		unsigned int hash = InitialFNV;

		for (int i = 0; m_string1.c_str()[i]; i++)
		{
			hash = hash ^ (m_string1.c_str()[i]); /* xor  the low 8 bits */
			hash = hash * FNVMultiple;            /* multiply by the magic number */
		}
		m_hash = hash;
	}